

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

void __thiscall UTF32Test_encode_codepoint_Test::TestBody(UTF32Test_encode_codepoint_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_390 [8];
  Message local_388 [8];
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_380;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_370;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_10;
  Message local_338 [8];
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_330;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_320;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_9;
  Message local_2e8 [8];
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_2e0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_2d0;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_8;
  Message local_298 [8];
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_290;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_280;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_7;
  Message local_248 [8];
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_240;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_230;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_6;
  Message local_1f8 [8];
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_1f0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_5;
  Message local_1a8 [8];
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_1a0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_190;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_4;
  Message local_158 [8];
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_150;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_140;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_3;
  Message local_108 [8];
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_100;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_f0;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8 [8];
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_b0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_a0;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [24];
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_50;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  UTF32Test_encode_codepoint_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  jessilib::encode_codepoint_u32_abi_cxx11_((wchar32)&local_40);
  local_50 = sv(L"",1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_nullptr>
            ((EqHelper *)local_20,"encode_codepoint_u32(U\'\\0\')","U\"\\0\"sv",&local_40,&local_50)
  ;
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  jessilib::encode_codepoint_u32_abi_cxx11_((wchar32)&local_a0);
  local_b0 = sv(L"A",1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_nullptr>
            ((EqHelper *)local_80,"encode_codepoint_u32(U\'A\')","U\"A\"sv",&local_a0,&local_b0);
  std::__cxx11::u32string::~u32string((u32string *)&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  jessilib::encode_codepoint_u32_abi_cxx11_((wchar32)&local_f0);
  local_100 = sv(L"z",1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_nullptr>
            ((EqHelper *)local_d0,"encode_codepoint_u32(U\'z\')","U\"z\"sv",&local_f0,&local_100);
  std::__cxx11::u32string::~u32string((u32string *)&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  jessilib::encode_codepoint_u32_abi_cxx11_((wchar32)&local_140);
  local_150 = sv(L"\x7f",1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_nullptr>
            ((EqHelper *)local_120,"encode_codepoint_u32(U\'\\u007F\')","U\"\\u007F\"sv",&local_140,
             &local_150);
  std::__cxx11::u32string::~u32string((u32string *)&local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  jessilib::encode_codepoint_u32_abi_cxx11_((wchar32)&local_190);
  local_1a0 = sv(L"\x80",1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_nullptr>
            ((EqHelper *)local_170,"encode_codepoint_u32(U\'\\u0080\')","U\"\\u0080\"sv",&local_190,
             &local_1a0);
  std::__cxx11::u32string::~u32string((u32string *)&local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  jessilib::encode_codepoint_u32_abi_cxx11_((wchar32)&local_1e0);
  local_1f0 = sv(L"߿",1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_nullptr>
            ((EqHelper *)local_1c0,"encode_codepoint_u32(U\'\\u07FF\')","U\"\\u07FF\"sv",&local_1e0,
             &local_1f0);
  std::__cxx11::u32string::~u32string((u32string *)&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  jessilib::encode_codepoint_u32_abi_cxx11_((wchar32)&local_230);
  local_240 = sv(L"ࠀ",1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_nullptr>
            ((EqHelper *)local_210,"encode_codepoint_u32(U\'\\u0800\')","U\"\\u0800\"sv",&local_230,
             &local_240);
  std::__cxx11::u32string::~u32string((u32string *)&local_230);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(local_248);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  jessilib::encode_codepoint_u32_abi_cxx11_((wchar32)&local_280);
  local_290 = sv(L"\xffff",1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_nullptr>
            ((EqHelper *)local_260,"encode_codepoint_u32(U\'\\uFFFF\')","U\"\\uFFFF\"sv",&local_280,
             &local_290);
  std::__cxx11::u32string::~u32string((u32string *)&local_280);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(local_298);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  jessilib::encode_codepoint_u32_abi_cxx11_((wchar32)&local_2d0);
  local_2e0 = sv(L"𐀀",1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_nullptr>
            ((EqHelper *)local_2b0,"encode_codepoint_u32(U\'\\U00010000\')","U\"\\U00010000\"sv",
             &local_2d0,&local_2e0);
  std::__cxx11::u32string::~u32string((u32string *)&local_2d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(local_2e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  jessilib::encode_codepoint_u32_abi_cxx11_((wchar32)&local_320);
  local_330 = sv(L"\x0010ffff",1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_nullptr>
            ((EqHelper *)local_300,"encode_codepoint_u32(U\'\\U0010FFFF\')","U\"\\U0010FFFF\"sv",
             &local_320,&local_330);
  std::__cxx11::u32string::~u32string((u32string *)&local_320);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(local_338);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  jessilib::encode_codepoint_u32_abi_cxx11_((wchar32)&local_370);
  local_380 = sv(L"😄",1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_nullptr>
            ((EqHelper *)local_350,"encode_codepoint_u32(U\'\\U0001F604\')","U\"\\U0001F604\"sv",
             &local_370,&local_380);
  std::__cxx11::u32string::~u32string((u32string *)&local_370);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(local_388);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              (local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(local_390,local_388);
    testing::internal::AssertHelper::~AssertHelper(local_390);
    testing::Message::~Message(local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  return;
}

Assistant:

TEST(UTF32Test, encode_codepoint) {
	EXPECT_EQ(encode_codepoint_u32(U'\0'), U"\0"sv);
	EXPECT_EQ(encode_codepoint_u32(U'A'), U"A"sv);
	EXPECT_EQ(encode_codepoint_u32(U'z'), U"z"sv);
	EXPECT_EQ(encode_codepoint_u32(U'\u007F'), U"\u007F"sv);
	EXPECT_EQ(encode_codepoint_u32(U'\u0080'), U"\u0080"sv);
	EXPECT_EQ(encode_codepoint_u32(U'\u07FF'), U"\u07FF"sv);
	EXPECT_EQ(encode_codepoint_u32(U'\u0800'), U"\u0800"sv);
	EXPECT_EQ(encode_codepoint_u32(U'\uFFFF'), U"\uFFFF"sv);
	EXPECT_EQ(encode_codepoint_u32(U'\U00010000'), U"\U00010000"sv);
	EXPECT_EQ(encode_codepoint_u32(U'\U0010FFFF'), U"\U0010FFFF"sv);
	EXPECT_EQ(encode_codepoint_u32(U'\U0001F604'), U"\U0001F604"sv);
}